

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  __pid_t _Var3;
  undefined4 uVar4;
  uint uVar5;
  int *piVar6;
  __off_t _Var7;
  CManager p_Var8;
  undefined8 uVar9;
  FILE *pFVar10;
  ostream *poVar11;
  long lVar12;
  int fd;
  char *pcVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int local_4bc;
  int Port;
  char final_filename [256];
  Remote_evpath_state ev_state;
  char buffer [256];
  ofstream fileOut;
  
  std::ofstream::ofstream(&fileOut);
  iVar2 = 0;
  local_4bc = 0;
  iVar14 = 0;
  iVar15 = 0;
  for (iVar16 = 1; iVar16 < argc; iVar16 = iVar16 + 1) {
    pcVar13 = argv[iVar16];
    iVar1 = strcmp(pcVar13,"-background");
    if (iVar1 == 0) {
      iVar15 = iVar15 + 1;
    }
    else {
      iVar1 = strcmp(pcVar13,"-kill_server");
      if (iVar1 == 0) {
        iVar14 = iVar14 + 1;
      }
      else {
        iVar1 = strcmp(pcVar13,"-report_port_selection");
        if (iVar1 == 0) {
          report_port_selection = report_port_selection + 1;
        }
        else {
          iVar1 = strcmp(pcVar13,"-status");
          if (iVar1 == 0) {
            iVar2 = iVar2 + 1;
          }
          else {
            iVar1 = strcmp(pcVar13,"-no_timeout");
            if (iVar1 == 0) {
              local_4bc = local_4bc + 1;
            }
            else {
              if (*pcVar13 != '-') {
LAB_00111501:
                fprintf(_stderr,"Unknown argument \"%s\"\n",pcVar13);
                goto LAB_0011155d;
              }
              if ((pcVar13[1] == 'v') && (pcVar13[2] == '\0')) {
                verbose = verbose + 1;
              }
              else if ((pcVar13[1] == 'q') && (pcVar13[2] == '\0')) {
                verbose = verbose + -1;
              }
              else if ((pcVar13[1] == 'l') && (pcVar13[2] == '\0')) {
                iVar16 = iVar16 + 1;
                if (argc <= iVar16) {
                  pcVar13 = "Flag -l requires an argument\n";
LAB_0011153f:
                  fwrite(pcVar13,0x1d,1,_stderr);
LAB_0011155d:
                  fwrite("Usage:  adios2_remote_server [-background] [-kill_server] [-no_timeout] [-status] [-v] [-q] [-l logfile] [-t nthreads]\n"
                         ,0x77,1,_stderr);
                  exit(1);
                }
                std::ofstream::open((char *)&fileOut,(_Ios_Openmode)argv[iVar16]);
                std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
              }
              else {
                if ((pcVar13[1] != 't') || (pcVar13[2] != '\0')) goto LAB_00111501;
                iVar16 = iVar16 + 1;
                if (argc <= iVar16) {
                  pcVar13 = "Flag -t requires an argument\n";
                  goto LAB_0011153f;
                }
                maxThreads = strtol(argv[iVar16],(char **)0x0,10);
              }
            }
          }
        }
      }
    }
  }
  if (iVar14 == 0) {
    if (iVar2 == 0) {
      if (iVar15 != 0) {
        if ((verbose != 0) && (report_port_selection == 0)) {
          puts("Forking server to background");
        }
        parent_pid = getpid();
        _Var3 = fork();
        if (_Var3 != 0) {
          if (report_port_selection != 0) {
            snprintf(final_filename,0x100,"/tmp/port_file_%x",(ulong)(uint)parent_pid);
            while( true ) {
              pFVar10 = fopen(final_filename,"r");
              if (pFVar10 != (FILE *)0x0) break;
              sleep(1);
            }
            fread(buffer,1,0x100,pFVar10);
            fputs(buffer,_stdout);
            fflush(_stdout);
          }
          close(0);
          close(1);
          close(2);
          goto LAB_00111580;
        }
        for (iVar16 = 0; iVar16 != 0x11; iVar16 = iVar16 + 1) {
          iVar2 = fcntl(iVar16,1);
          if (iVar2 == -1) {
            piVar6 = __errno_location();
            if (*piVar6 != 9) goto LAB_0011126e;
          }
          else {
LAB_0011126e:
            _Var7 = lseek(iVar16,0,1);
            if (_Var7 == -1) {
              piVar6 = __errno_location();
              if (*piVar6 == 0x1d) {
                close(iVar16);
              }
            }
          }
        }
      }
      p_Var8 = (CManager)CManager_create();
      if (local_4bc == 0) {
        buffer[0] = '\0';
        buffer[1] = '\0';
        buffer[2] = '\0';
        buffer[3] = '\0';
        buffer[4] = '\0';
        buffer[5] = '\0';
        buffer[6] = '\0';
        buffer[7] = '\0';
        final_filename._0_8_ = operator_new(0x18);
        *(undefined ***)final_filename._0_8_ = &PTR___State_0013faf8;
        *(CManager *)(final_filename._0_8_ + 8) = p_Var8;
        *(undefined4 *)(final_filename._0_8_ + 0x10) = 60000;
        std::thread::_M_start_thread(buffer,final_filename,0);
        if (final_filename._0_8_ != 0) {
          (**(code **)(*(long *)final_filename._0_8_ + 8))();
        }
        std::thread::detach();
        std::thread::~thread((thread *)buffer);
      }
      uVar4 = attr_atom_from_string("IP_PORT");
      uVar9 = create_attr_list();
      if (report_port_selection == 0) {
        add_attr(uVar9,uVar4,1,0x6658);
        CMlisten_specific(p_Var8,uVar9);
      }
      else {
        CMlisten(p_Var8);
        uVar9 = CMget_contact_list(p_Var8);
        get_int_attr(uVar9,uVar4);
        uVar5 = getpid();
        snprintf(final_filename,0x100,"/tmp/port_file_%x",(ulong)uVar5);
        snprintf(buffer,0x100,"/tmp/port_file_%x",(ulong)(uint)parent_pid);
        pFVar10 = fopen(final_filename,"w");
        random_cookie = rand64();
        fprintf(pFVar10,"port:%d;msg:%s;cookie:%#018lx\n",0xffffffff,"no_error",random_cookie);
        fclose(pFVar10);
        rename(final_filename,buffer);
      }
      poVar11 = std::operator<<((ostream *)&std::cout,"Hostname = ");
      adios2::helper::GetFQDN_abi_cxx11_();
      poVar11 = std::operator<<(poVar11,(string *)final_filename);
      std::endl<char,std::char_traits<char>>(poVar11);
      std::__cxx11::string::~string((string *)final_filename);
      lVar12 = CMget_contact_list(p_Var8);
      if (lVar12 != 0) {
        final_filename[0] = -1;
        final_filename[1] = -1;
        final_filename[2] = -1;
        final_filename[3] = -1;
        get_int_attr(uVar9,uVar4);
        poVar11 = std::operator<<((ostream *)&std::cout,"Listening on Port ");
        poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,final_filename._0_4_);
        std::endl<char,std::char_traits<char>>(poVar11);
      }
      ev_state.cm = p_Var8;
      poVar11 = std::operator<<((ostream *)&std::cout,"Max threads = ");
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::endl<char,std::char_traits<char>>(poVar11);
      adios2::EVPathRemoteCommon::RegisterFormats(&ev_state);
      ServerRegisterHandlers(&ev_state);
      CMrun_network(p_Var8);
      std::ofstream::~ofstream(&fileOut);
      return 0;
    }
    connect_and_get_status(0x6658);
  }
  else {
    connect_and_kill(0x6658);
  }
LAB_00111580:
  exit(0);
}

Assistant:

int main(int argc, char **argv)
{
    CManager cm;
    struct Remote_evpath_state ev_state;
    int background = 0;
    int kill_server = 0;
    int status_server = 0;
    int no_timeout = 0; // default to timeout
    std::ofstream fileOut;

    for (int i = 1; i < argc; i++)
    {
        if (strcmp(argv[i], "-background") == 0)
        {
            background++;
        }
        else if (strcmp(argv[i], "-kill_server") == 0)
        {
            kill_server++;
        }
        else if (strcmp(argv[i], "-report_port_selection") == 0)
        {
            report_port_selection++;
        }
        else if (strcmp(argv[i], "-status") == 0)
        {
            status_server++;
        }
        else if (strcmp(argv[i], "-no_timeout") == 0)
        {
            no_timeout++;
        }
        else if (strcmp(argv[i], "-v") == 0)
        {
            verbose++;
        }
        else if (strcmp(argv[i], "-q") == 0)
        {
            verbose--;
        }
        else if (strcmp(argv[i], "-l") == 0)
        {
            i++;
            if (argc <= i)
            {
                fprintf(stderr, "Flag -l requires an argument\n");
                fprintf(stderr, usage);
                exit(1);
            }
            char *filename = argv[i];
            // Opening the output file stream and associate it with
            // logfile
            fileOut.open(filename);

            // Redirecting cout to write to logfile
            std::cout.rdbuf(fileOut.rdbuf());
        }
        else if (strcmp(argv[i], "-t") == 0)
        {
            i++;
            if (argc <= i)
            {
                fprintf(stderr, "Flag -t requires an argument\n");
                fprintf(stderr, usage);
                exit(1);
            }
            maxThreads = strtol(argv[i], nullptr, 10);
        }
        else
        {
            fprintf(stderr, "Unknown argument \"%s\"\n", argv[i]);
            fprintf(stderr, usage);
            exit(1);
        }
    }

    if (kill_server)
    {
        connect_and_kill(ServerPort);
        exit(0);
    }
    if (status_server)
    {
        connect_and_get_status(ServerPort);
        exit(0);
    }
    if (background)
    {
        if (verbose && !report_port_selection)
        {
            printf("Forking server to background\n");
        }
#ifdef _MSC_VER
        STARTUPINFO si;
        PROCESS_INFORMATION pi;
        char comm_line[8191];

        ZeroMemory(&si, sizeof(si));
        si.cb = sizeof(si);
        ZeroMemory(&pi, sizeof(pi));
        char module[MAX_PATH];
        GetModuleFileName(NULL, &module[0], MAX_PATH);
        int i = 1;
        strcpy(comm_line, module);
        strcat(comm_line, " ");
        if (!CreateProcess(module, comm_line,
                           NULL,  // Process handle not inheritable
                           NULL,  // Thread handle not inheritable
                           FALSE, // Set handle inheritance to FALSE
                           0,     // No creation flags
                           NULL,  // Use parent's environment block
                           NULL,  // Use parent's starting directory
                           &si,   // Pointer to STARTUPINFO structure
                           &pi))
        {
            printf("CreateProcess failed (%d).\n", GetLastError());
            //	    printf("Args were argv[0] = %s\n", args[0]);
            //	    printf("Args were argv[1] = %s, argv[2] = %s\n", args[1], args[2]);
            exit(1);
        }
        exit(0);
#else
        parent_pid = getpid();
        if (fork() != 0)
        {
            /* I'm the parent, wait a sec to let the child start, then exit */
            //            sleep(1);
            if (report_port_selection)
            {
                char final_filename[256];
                snprintf(final_filename, sizeof(final_filename), "/tmp/port_file_%x", parent_pid);
                FILE *f = NULL;
                f = fopen(final_filename, "r");
                while (f == NULL)
                {
                    sleep(1); // wait until available
                    f = fopen(final_filename, "r");
                }
                char buffer[256];
                fread(buffer, 1, 256, f);
                // Note: printf("%s", buffer); does not seem to flush properly
                fprintf(stdout, "%s", buffer);
                fflush(stdout);
            }
            close(0);
            close(1);
            close(2);
            exit(0);
        }

        //  Why close a bunch of FDs here?  Well, if we've linked with XRootD, stderr might have
        //  been dup()'d in library initialization.  We don't need those FDs and we have to
        //  close them to make sure we disassociate from the CTest parent (or else fixture
        //  startup hangs). It doesn't seem to work to close them before the fork, so we close
        //  them afterwards.
        for (int fd = 0; fd <= 16; fd++)
        {
            if (fd_is_valid(fd))
            {
                // OK, fd is valid, should we close it?
                if ((lseek(fd, 0, SEEK_CUR) == -1) && (errno == ESPIPE))
                {
                    // In the circumstances we care about (running under CTest), we want to
                    // close FDs that are pipes.  The condition above tests for that and we
                    // should get here only if it's a pipe.
                    close(fd);
                }
            }
        }
#endif
    }

    cm = CManager_create();
    if (!no_timeout)
        timer_start((void *)cm, 60 * 1000); // check timeout on 1 minute boundaries
    CM_IP_PORT = attr_atom_from_string("IP_PORT");
    attr_list listen_list = NULL;

    if (listen_list == NULL)
        listen_list = create_attr_list();
    if (!report_port_selection)
    {
        // listen on well-known port
        add_attr(listen_list, CM_IP_PORT, Attr_Int4, (attr_value)ServerPort);
        CMlisten_specific(cm, listen_list);
    }
    else
    {
        // randomize port
        CMlisten(cm);
        listen_list = CMget_contact_list(cm);
        int Port = -1;
        get_int_attr(listen_list, CM_IP_PORT, &Port);
        char filename[256];
        char final_filename[256];
        snprintf(filename, sizeof(filename), "/tmp/port_file_%x", getpid());
        snprintf(final_filename, sizeof(final_filename), "/tmp/port_file_%x", parent_pid);
        FILE *f = fopen(filename, "w");
        random_cookie = rand64();
        fprintf(f, "port:%d;msg:%s;cookie:%#018" PRIx64 "\n", Port, "no_error", random_cookie);
        fclose(f);
        rename(filename, final_filename);
    }

    std::cout << "Hostname = " << helper::GetFQDN() << std::endl;
    attr_list contact_list = CMget_contact_list(cm);
    if (contact_list)
    {
        int Port = -1;
        get_int_attr(listen_list, CM_IP_PORT, &Port);
        std::cout << "Listening on Port " << Port << std::endl;
    }
    ev_state.cm = cm;
    std::cout << "Max threads = " << maxThreads << std::endl;

    RegisterFormats(ev_state);

    ServerRegisterHandlers(ev_state);

    CMrun_network(cm);
    return 0;
}